

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

iterator * __thiscall
phmap::priv::
parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
::begin(iterator *__return_storage_ptr__,
       parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
       *this)

{
  reference inner;
  reference pvVar1;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  iterator *it;
  iterator local_20;
  parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_10;
  parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_local;
  
  local_10 = this;
  inner = std::
          array<phmap::priv::parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>::Inner,_64UL>
          ::operator[](&this->sets_,0);
  pvVar1 = std::
           array<phmap::priv::parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>::Inner,_64UL>
           ::operator[](&this->sets_,0);
  this_00 = &std::
             array<phmap::priv::parallel_hash_set<6UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>::Inner,_64UL>
             ::operator[](&this->sets_,0)->set_;
  local_20 = raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
             ::begin(this_00);
  iterator::iterator(__return_storage_ptr__,inner,pvVar1 + 0x40,&local_20);
  iterator::skip_empty(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() {
        auto it = iterator(&sets_[0], &sets_[0] + num_tables, sets_[0].set_.begin());
        it.skip_empty();
        return it;
    }